

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::subtract<float>(image *this,ConstPtr *i1,ConstPtr *i2)

{
  int width;
  int height;
  int chans;
  element_type *peVar1;
  element_type *peVar2;
  pointer pfVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  invalid_argument *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Ptr PVar8;
  
  peVar1 = (i2->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
  }
  else {
    peVar2 = (i1->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    width = (peVar2->super_TypedImageBase<float>).super_ImageBase.w;
    if (((width == (peVar1->super_TypedImageBase<float>).super_ImageBase.w) &&
        (height = (peVar2->super_TypedImageBase<float>).super_ImageBase.h,
        height == (peVar1->super_TypedImageBase<float>).super_ImageBase.h)) &&
       (chans = (peVar2->super_TypedImageBase<float>).super_ImageBase.c,
       chans == (peVar1->super_TypedImageBase<float>).super_ImageBase.c)) {
      Image<float>::create();
      TypedImageBase<float>::allocate(*(TypedImageBase<float> **)this,width,height,chans);
      peVar1 = (i1->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      pfVar3 = (peVar1->super_TypedImageBase<float>).data.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar5 = (ulong)((long)*(pointer *)
                             ((long)&(peVar1->super_TypedImageBase<float>).data.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data + 8) - (long)pfVar3) >> 2;
      _Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this;
      uVar7 = 0;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = uVar7;
      }
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)(*(long *)&_Var4._M_pi[1]._M_use_count + uVar7 * 4) =
             pfVar3[uVar7] -
             (((i2->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->super_TypedImageBase<float>).data.super__Vector_base<float,_std::allocator<float>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
      }
      PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar8.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Image dimensions do not match");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
subtract (typename Image<T>::ConstPtr i1, typename Image<T>::ConstPtr i2)
{
    int const iw = i1->width();
    int const ih = i1->height();
    int const ic = i1->channels();

    if (i1 == nullptr || i2 == nullptr)
        throw std::invalid_argument("Null image given");

    if (iw != i2->width() || ih != i2->height() || ic != i2->channels())
        throw std::invalid_argument("Image dimensions do not match");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(iw, ih, ic);

    // FIXME: That needs speedup! STL algo with pointers.
    for (int i = 0; i < i1->get_value_amount(); ++i)
        out->at(i) = i1->at(i) - i2->at(i);

    return out;
}